

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::EndStep(SscWriterGeneric *this,bool writerLocked)

{
  thread local_28;
  SscWriterGeneric *local_20;
  code *local_18;
  undefined8 local_10;
  
  this->m_WriterDefinitionsLocked = writerLocked;
  if ((this->super_SscWriterBase).m_CurrentStep == 0) {
    if ((this->super_SscWriterBase).m_Threading != true) {
      EndStepFirst(this);
      return;
    }
    local_18 = EndStepFirst;
  }
  else {
    if ((writerLocked) && (this->m_ReaderSelectionsLocked == true)) {
      EndStepConsequentFixed(this);
      return;
    }
    if ((this->super_SscWriterBase).m_Threading != true) {
      EndStepConsequentFlexible(this);
      return;
    }
    local_18 = EndStepConsequentFlexible;
  }
  local_10 = 0;
  local_20 = this;
  std::thread::
  thread<void(adios2::core::engine::ssc::SscWriterGeneric::*)(),adios2::core::engine::ssc::SscWriterGeneric*,void>
            (&local_28,(offset_in_SscWriterGeneric_to_subr *)&local_18,&local_20);
  if ((this->m_EndStepThread)._M_id._M_thread == 0) {
    (this->m_EndStepThread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void SscWriterGeneric::EndStep(const bool writerLocked)
{

    m_WriterDefinitionsLocked = writerLocked;

    if (m_CurrentStep == 0)
    {
        if (m_Threading)
        {
            m_EndStepThread = std::thread(&SscWriterGeneric::EndStepFirst, this);
        }
        else
        {
            EndStepFirst();
        }
    }
    else
    {
        if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
        {
            EndStepConsequentFixed();
        }
        else
        {
            if (m_Threading)
            {
                m_EndStepThread = std::thread(&SscWriterGeneric::EndStepConsequentFlexible, this);
            }
            else
            {
                EndStepConsequentFlexible();
            }
        }
    }
}